

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

bool DiffTest<Blob<256>,Blob<224>>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> diffs;
  Rand local_c8;
  Blob<224> h2;
  Blob<224> h1;
  Blob<256> k2;
  Blob<256> k1;
  
  dVar3 = chooseUpToK(0x100,diffbits);
  diffs.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.x = 0x331facd4;
  local_c8.y = 0x1046679a;
  local_c8.z = 0x5cd2ef35;
  local_c8.w = 0xfda8c6ef;
  diffs.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _0_16_ = ZEXT816(0) << 0x20;
  k1.bytes[0] = '\0';
  k1.bytes[1] = '\0';
  k1.bytes[2] = '\0';
  k1.bytes[3] = '\0';
  k1.bytes[4] = '\0';
  k1.bytes[5] = '\0';
  k1.bytes[6] = '\0';
  k1.bytes[7] = '\0';
  k1.bytes[8] = '\0';
  k1.bytes[9] = '\0';
  k1.bytes[10] = '\0';
  k1.bytes[0xb] = '\0';
  k1.bytes[0xc] = '\0';
  k1.bytes[0xd] = '\0';
  k1.bytes[0xe] = '\0';
  k1.bytes[0xf] = '\0';
  k1.bytes[0x10] = '\0';
  k1.bytes[0x11] = '\0';
  k1.bytes[0x12] = '\0';
  k1.bytes[0x13] = '\0';
  k1.bytes[0x14] = '\0';
  k1.bytes[0x15] = '\0';
  k1.bytes[0x16] = '\0';
  k1.bytes[0x17] = '\0';
  k1.bytes[0x18] = '\0';
  k1.bytes[0x19] = '\0';
  k1.bytes[0x1a] = '\0';
  k1.bytes[0x1b] = '\0';
  k1.bytes[0x1c] = '\0';
  k1.bytes[0x1d] = '\0';
  k1.bytes[0x1e] = '\0';
  k1.bytes[0x1f] = '\0';
  k2.bytes[0] = '\0';
  k2.bytes[1] = '\0';
  k2.bytes[2] = '\0';
  k2.bytes[3] = '\0';
  k2.bytes[4] = '\0';
  k2.bytes[5] = '\0';
  k2.bytes[6] = '\0';
  k2.bytes[7] = '\0';
  k2.bytes[8] = '\0';
  k2.bytes[9] = '\0';
  k2.bytes[10] = '\0';
  k2.bytes[0xb] = '\0';
  k2.bytes[0xc] = '\0';
  k2.bytes[0xd] = '\0';
  k2.bytes[0xe] = '\0';
  k2.bytes[0xf] = '\0';
  k2.bytes[0x10] = '\0';
  k2.bytes[0x11] = '\0';
  k2.bytes[0x12] = '\0';
  k2.bytes[0x13] = '\0';
  k2.bytes[0x14] = '\0';
  k2.bytes[0x15] = '\0';
  k2.bytes[0x16] = '\0';
  k2.bytes[0x17] = '\0';
  k2.bytes[0x18] = '\0';
  k2.bytes[0x19] = '\0';
  k2.bytes[0x1a] = '\0';
  k2.bytes[0x1b] = '\0';
  k2.bytes[0x1c] = '\0';
  k2.bytes[0x1d] = '\0';
  k2.bytes[0x1e] = '\0';
  k2.bytes[0x1f] = '\0';
  h1.bytes._16_12_ = SUB1612(ZEXT816(0),0);
  h1.bytes._0_12_ =
       diffs.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
       super__Vector_impl_data._0_12_;
  h1.bytes[0xc] = '\0';
  h1.bytes[0xd] = '\0';
  h1.bytes[0xe] = '\0';
  h1.bytes[0xf] = '\0';
  h2.bytes._0_12_ = h1.bytes._0_12_;
  h2.bytes._12_4_ = h1.bytes._12_4_;
  h2.bytes._16_12_ = h1.bytes._16_12_;
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         (ulong)(uint)diffbits,0x100,0xe0);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",dVar3 * (double)reps,
         dVar3 * (double)reps * 3.7092061506874214e-68,(ulong)(uint)reps);
  if (0 < reps) {
    uVar2 = 0;
    do {
      if ((int)((ulong)uVar2 % ((ulong)(uint)reps / 10)) == 0) {
        putchar(0x2e);
      }
      Rand::rand_p(&local_c8,&k1,0x20);
      k2.bytes[0] = k1.bytes[0];
      k2.bytes[1] = k1.bytes[1];
      k2.bytes[2] = k1.bytes[2];
      k2.bytes[3] = k1.bytes[3];
      k2.bytes[4] = k1.bytes[4];
      k2.bytes[5] = k1.bytes[5];
      k2.bytes[6] = k1.bytes[6];
      k2.bytes[7] = k1.bytes[7];
      k2.bytes[8] = k1.bytes[8];
      k2.bytes[9] = k1.bytes[9];
      k2.bytes[10] = k1.bytes[10];
      k2.bytes[0xb] = k1.bytes[0xb];
      k2.bytes[0xc] = k1.bytes[0xc];
      k2.bytes[0xd] = k1.bytes[0xd];
      k2.bytes[0xe] = k1.bytes[0xe];
      k2.bytes[0xf] = k1.bytes[0xf];
      k2.bytes[0x10] = k1.bytes[0x10];
      k2.bytes[0x11] = k1.bytes[0x11];
      k2.bytes[0x12] = k1.bytes[0x12];
      k2.bytes[0x13] = k1.bytes[0x13];
      k2.bytes[0x14] = k1.bytes[0x14];
      k2.bytes[0x15] = k1.bytes[0x15];
      k2.bytes[0x16] = k1.bytes[0x16];
      k2.bytes[0x17] = k1.bytes[0x17];
      k2.bytes[0x18] = k1.bytes[0x18];
      k2.bytes[0x19] = k1.bytes[0x19];
      k2.bytes[0x1a] = k1.bytes[0x1a];
      k2.bytes[0x1b] = k1.bytes[0x1b];
      k2.bytes[0x1c] = k1.bytes[0x1c];
      k2.bytes[0x1d] = k1.bytes[0x1d];
      k2.bytes[0x1e] = k1.bytes[0x1e];
      k2.bytes[0x1f] = k1.bytes[0x1f];
      (*hash)(&k1,0x20,0,&h1);
      DiffTestRecurse<Blob<256>,Blob<224>>(hash,&k1,&k2,&h1,&h2,0,diffbits,&diffs);
      uVar2 = uVar2 + 1;
    } while (reps != uVar2);
  }
  putchar(10);
  bVar1 = ProcessDifferentials<Blob<256>>(&diffs,reps,dumpCollisions);
  if (diffs.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(diffs.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}